

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  sqlite3_mutex *psVar5;
  sqlite3_stmt *psVar6;
  Fts3SegReader **ppFVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  Vdbe *pVVar11;
  Mem *pMVar12;
  u64 uVar13;
  u32 *puVar14;
  u32 *puVar15;
  uchar *puVar16;
  undefined1 *puVar17;
  i64 iVar18;
  byte bVar19;
  sqlite3_tokenizer_module *aSzDel;
  Vdbe *p;
  char *pcVar20;
  char *pcVar21;
  sqlite3_tokenizer_cursor *psVar22;
  long lVar23;
  sqlite3_value *psVar24;
  uchar uVar25;
  uchar uVar26;
  ulong uVar27;
  ulong uVar28;
  char *z;
  byte *pbVar29;
  Fts3Table *pFVar30;
  int iVar31;
  uint uVar32;
  Fts3Index *pFVar33;
  bool bVar34;
  bool bVar35;
  int nChng;
  i64 iCol;
  i64 iDocid;
  sqlite3_tokenizer_cursor *pT;
  sqlite3_stmt *pAllLangid;
  sqlite3_stmt *pStmt;
  int local_13c;
  Fts3Table *local_138;
  Vdbe *local_130;
  int local_128;
  int local_124;
  ulong local_120;
  ulong local_118;
  sqlite3_tokenizer_module *local_110;
  int local_104;
  char *local_100;
  Fts3SegFilter local_f8;
  ulong local_e0;
  u32 *local_d8;
  ulong local_d0;
  u32 *local_c8;
  u32 *local_c0;
  sqlite3_stmt *local_b8;
  sqlite3_tokenizer_cursor *local_b0;
  Fts3MultiSegReader local_a8;
  Vdbe *local_48;
  long local_40;
  long local_38;
  
  local_13c = 0;
  local_128 = 0;
  local_138 = (Fts3Table *)pVtab;
  if (nArg < 2) {
LAB_001cedd2:
    iVar8 = *(int *)&pVtab[2].pModule;
    iVar31 = sqlite3_initialize();
    if ((iVar31 == 0) &&
       (puVar14 = (u32 *)sqlite3Malloc((long)iVar8 * 8 + 8), pFVar30 = local_138,
       puVar14 != (u32 *)0x0)) {
      iVar8 = local_138->nColumn;
      memset(puVar14,0,(long)iVar8 * 8 + 8);
      if (pFVar30->nPendingData == 0) {
        iVar31 = fts3SqlStmt(pFVar30,0x10,(sqlite3_stmt **)&local_a8,(sqlite3_value **)0x0);
        ppFVar7 = local_a8.apSegment;
        if (iVar31 != 0) goto LAB_001cf678;
        iVar31 = vdbeUnbind((Vdbe *)local_a8.apSegment,1);
        if ((iVar31 == 0) &&
           (psVar5 = (*(sqlite3 **)ppFVar7)->mutex, psVar5 != (sqlite3_mutex *)0x0)) {
          (*sqlite3Config.mutex.xMutexLeave)(psVar5);
        }
        sqlite3_step((sqlite3_stmt *)ppFVar7);
        local_13c = sqlite3_reset((sqlite3_stmt *)ppFVar7);
        iVar31 = local_13c;
        if (local_13c != 0) goto LAB_001cf678;
      }
      else {
        local_13c = 0;
      }
      bVar34 = true;
      if ((1 < nArg) && (local_138->zContentTbl == (char *)0x0)) {
        psVar24 = apVal[(long)local_138->nColumn + 3];
        uVar2._0_2_ = psVar24->flags;
        uVar2._2_1_ = psVar24->enc;
        uVar2._3_1_ = psVar24->eSubtype;
        bVar19 = (byte)(undefined2)uVar2;
        if ((0xaaaaaaaaU >> (uVar2 & 0x1f) & 1) != 0) {
          psVar24 = apVal[1];
          bVar19 = (byte)psVar24->flags;
        }
        if ((0xaaaaaaaaUL >> (bVar19 & 0x1f) & 1) == 0) {
          pMVar12 = *apVal;
          uVar3._0_2_ = pMVar12->flags;
          uVar3._2_1_ = pMVar12->enc;
          uVar3._3_1_ = pMVar12->eSubtype;
          if ((0xaaaaaaaaU >> (uVar3 & 0x1f) & 1) == 0) {
            local_130 = (Vdbe *)sqlite3VdbeIntValue(pMVar12);
            pVVar11 = (Vdbe *)sqlite3VdbeIntValue(psVar24);
            bVar34 = true;
            if (local_130 == pVVar11) goto LAB_001cf54f;
          }
          bVar34 = local_138->db->vtabOnConflict == '\x05';
          if (bVar34) {
            local_13c = fts3DeleteByRowid(local_138,psVar24,&local_128,puVar14);
          }
          else {
            local_13c = fts3InsertData(local_138,apVal,pRowid);
          }
          iVar31 = local_13c;
          if (local_13c != 0) goto LAB_001cf678;
        }
      }
LAB_001cf54f:
      bVar35 = true;
      psVar24 = *apVal;
      uVar4._0_2_ = psVar24->flags;
      uVar4._2_1_ = psVar24->enc;
      uVar4._3_1_ = psVar24->eSubtype;
      if ((0xaaaaaaaaU >> (uVar4 & 0x1f) & 1) == 0) {
        local_13c = fts3DeleteByRowid(local_138,psVar24,&local_128,puVar14);
        bVar35 = local_13c == 0;
      }
      pFVar30 = local_138;
      puVar15 = puVar14 + (long)iVar8 + 1;
      if ((1 < nArg) && (bVar35)) {
        local_130 = (Vdbe *)sqlite3VdbeIntValue(apVal[(long)local_138->nColumn + 4]);
        if ((bVar34) && (local_13c = fts3InsertData(pFVar30,apVal,pRowid), local_13c != 0)) {
          if ((local_13c == 0x13) && (pFVar30->zContentTbl == (char *)0x0)) {
            local_13c = 0x10b;
          }
        }
        else {
          iVar8 = (int)local_130;
          local_13c = fts3PendingTermsDocid(pFVar30,0,iVar8,*pRowid);
          if (local_13c == 0) {
            local_13c = fts3InsertTerms(pFVar30,iVar8,apVal,puVar15);
          }
        }
        if (pFVar30->bHasDocsize != '\0') {
          fts3InsertDocsize(&local_13c,pFVar30,puVar15);
        }
        local_128 = local_128 + 1;
      }
      iVar31 = local_13c;
      if (local_138->bFts4 != '\0') {
        fts3UpdateDocTotals(&local_13c,local_138,puVar15,puVar14,local_128);
        iVar31 = local_13c;
      }
      goto LAB_001cf678;
    }
    local_13c = 7;
    iVar31 = local_13c;
  }
  else {
    psVar24 = *apVal;
    uVar32._0_2_ = psVar24->flags;
    uVar32._2_1_ = psVar24->enc;
    uVar32._3_1_ = psVar24->eSubtype;
    if (((0xaaaaaaaaU >> (uVar32 & 0x1f) & 1) == 0) ||
       (psVar24 = apVal[(long)*(int *)&pVtab[2].pModule + 2], uVar1._0_2_ = psVar24->flags,
       uVar1._2_1_ = psVar24->enc, uVar1._3_1_ = psVar24->eSubtype,
       (0xaaaaaaaaU >> (uVar1 & 0x1f) & 1) != 0)) {
      iVar18 = sqlite3VdbeIntValue(apVal[(long)*(int *)&pVtab[2].pModule + 4]);
      if (-1 < (int)iVar18) goto LAB_001cedd2;
      local_13c = 0x13;
      iVar31 = local_13c;
    }
    else {
      pvVar10 = sqlite3ValueText(psVar24,'\x01');
      iVar8 = sqlite3ValueBytes(psVar24,'\x01');
      pFVar30 = local_138;
      if (pvVar10 == (void *)0x0) {
        iVar31 = 7;
      }
      else if (iVar8 == 7) {
        lVar23 = 0;
        do {
          if ((ulong)*(byte *)((long)pvVar10 + lVar23) == 0) {
            uVar26 = ""[(byte)"rebuild"[lVar23]];
            uVar25 = '\0';
LAB_001cf022:
            if (uVar25 != uVar26) goto LAB_001cf3b6;
            break;
          }
          uVar25 = ""[*(byte *)((long)pvVar10 + lVar23)];
          uVar26 = ""[(byte)"rebuild"[lVar23]];
          if (uVar25 != uVar26) goto LAB_001cf022;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 7);
        iVar31 = fts3DeleteAll(local_138,0);
        if (iVar31 != 0) goto LAB_001cf675;
        local_a8.apSegment = (Fts3SegReader **)0x0;
        pcVar20 = sqlite3_mprintf("SELECT %s",pFVar30->zReadExprlist);
        if (pcVar20 == (char *)0x0) {
          local_f8.zTerm = (char *)CONCAT44(local_f8.zTerm._4_4_,7);
LAB_001cf6ba:
          puVar14 = (u32 *)0x0;
          uVar32 = 0;
          aSzDel = (sqlite3_tokenizer_module *)0x0;
          pVVar11 = (Vdbe *)local_a8.apSegment;
          puVar15 = (u32 *)0x0;
        }
        else {
          iVar8 = sqlite3LockAndPrepare
                            (pFVar30->db,pcVar20,-1,0x80,(Vdbe *)0x0,(sqlite3_stmt **)&local_a8,
                             (char **)0x0);
          local_f8.zTerm = (char *)CONCAT44(local_f8.zTerm._4_4_,iVar8);
          sqlite3_free(pcVar20);
          if (iVar8 != 0) goto LAB_001cf6ba;
          iVar8 = pFVar30->nColumn;
          iVar31 = sqlite3_initialize();
          if (iVar31 != 0) {
LAB_001cf0c5:
            local_f8.zTerm = (char *)CONCAT44(local_f8.zTerm._4_4_,7);
            pFVar30 = local_138;
            goto LAB_001cf6ba;
          }
          uVar13 = (long)iVar8 * 0xc + 0xc;
          puVar14 = (u32 *)sqlite3Malloc(uVar13);
          if (puVar14 == (u32 *)0x0) goto LAB_001cf0c5;
          uVar32 = 0;
          memset(puVar14,0,uVar13);
          pVVar11 = (Vdbe *)local_a8.apSegment;
          pFVar30 = local_138;
          iVar8 = local_138->nColumn + 1;
          puVar15 = puVar14 + iVar8;
          local_110 = (sqlite3_tokenizer_module *)(puVar15 + iVar8);
          iVar8 = sqlite3_step((sqlite3_stmt *)local_a8.apSegment);
          aSzDel = local_110;
          if (iVar8 == 100) {
            uVar27 = 0;
            local_130 = pVVar11;
            local_d8 = puVar15;
            local_c8 = puVar14;
            do {
              local_d0 = uVar27;
              iVar8 = langidFromSelect(pFVar30,(sqlite3_stmt *)pVVar11);
              pMVar12 = columnMem((sqlite3_stmt *)pVVar11,0);
              iVar18 = sqlite3VdbeIntValue(pMVar12);
              columnMallocFailure((sqlite3_stmt *)pVVar11);
              local_e0 = CONCAT44(local_e0._4_4_,iVar8);
              iVar8 = fts3PendingTermsDocid(pFVar30,0,iVar8,iVar18);
              memset(puVar14,0,(long)pFVar30->nColumn * 4 + 4);
              if (iVar8 == 0) {
                lVar23 = 0;
                puVar15 = puVar14;
                do {
                  pVVar11 = local_130;
                  if (local_138->nColumn <= lVar23) {
                    iVar8 = 0;
                    break;
                  }
                  iVar8 = 0;
                  if (local_138->abNotindexed[lVar23] == '\0') {
                    iVar31 = (int)lVar23 + 1;
                    puVar16 = sqlite3_column_text((sqlite3_stmt *)local_130,iVar31);
                    pFVar30 = local_138;
                    iVar8 = fts3PendingTermsAdd(local_138,(int)local_e0,(char *)puVar16,(int)lVar23,
                                                puVar15);
                    puVar14 = local_c8;
                    iVar31 = sqlite3_column_bytes((sqlite3_stmt *)pVVar11,iVar31);
                    puVar14[pFVar30->nColumn] = puVar14[pFVar30->nColumn] + iVar31;
                  }
                  puVar15 = puVar15 + 1;
                  lVar23 = lVar23 + 1;
                } while (iVar8 == 0);
              }
              pFVar30 = local_138;
              local_f8.zTerm = (char *)CONCAT44(local_f8.zTerm._4_4_,iVar8);
              if (local_138->bHasDocsize != '\0') {
                fts3InsertDocsize((int *)&local_f8,local_138,puVar14);
                iVar8 = (int)local_f8.zTerm;
              }
              puVar15 = local_d8;
              pVVar11 = local_130;
              uVar32 = (uint)local_d0;
              if (iVar8 != 0) {
                sqlite3_finalize((sqlite3_stmt *)local_130);
                pVVar11 = (Vdbe *)0x0;
                aSzDel = local_110;
                puVar15 = local_d8;
                break;
              }
              if (-1 < pFVar30->nColumn) {
                lVar23 = -1;
                do {
                  local_d8[lVar23 + 1] = local_d8[lVar23 + 1] + puVar14[lVar23 + 1];
                  lVar23 = lVar23 + 1;
                } while (lVar23 < pFVar30->nColumn);
              }
              uVar32 = uVar32 + 1;
              uVar27 = (ulong)uVar32;
              iVar8 = sqlite3_step((sqlite3_stmt *)local_130);
              aSzDel = local_110;
            } while (iVar8 == 100);
          }
        }
        if (pFVar30->bFts4 != '\0') {
          fts3UpdateDocTotals((int *)&local_f8,pFVar30,puVar15,(u32 *)aSzDel,uVar32);
        }
        sqlite3_free(puVar14);
        if (pVVar11 == (Vdbe *)0x0) {
          iVar31 = (int)local_f8.zTerm;
        }
        else {
          iVar31 = sqlite3_finalize((sqlite3_stmt *)pVVar11);
          if ((int)local_f8.zTerm != 0) {
            iVar31 = (int)local_f8.zTerm;
          }
        }
      }
      else {
        if (iVar8 == 8) {
          lVar23 = 0;
          do {
            if ((ulong)*(byte *)((long)pvVar10 + lVar23) == 0) {
              uVar26 = ""[(byte)"optimize"[lVar23]];
              uVar25 = '\0';
LAB_001ceff7:
              if (uVar25 != uVar26) goto LAB_001cf3b6;
              break;
            }
            uVar25 = ""[*(byte *)((long)pvVar10 + lVar23)];
            uVar26 = ""[(byte)"optimize"[lVar23]];
            if (uVar25 != uVar26) goto LAB_001ceff7;
            lVar23 = lVar23 + 1;
          } while (lVar23 != 8);
          iVar31 = fts3DoOptimize(local_138,0);
          goto LAB_001cf675;
        }
        if (iVar8 == 0xf) {
          lVar23 = 0;
          do {
            if ((ulong)*(byte *)((long)pvVar10 + lVar23) == 0) {
              uVar26 = ""[(byte)"integrity-check"[lVar23]];
              uVar25 = '\0';
LAB_001cf0e2:
              if (uVar25 != uVar26) goto LAB_001cf3b6;
              break;
            }
            uVar25 = ""[*(byte *)((long)pvVar10 + lVar23)];
            uVar26 = ""[(byte)"integrity-check"[lVar23]];
            if (uVar25 != uVar26) goto LAB_001cf0e2;
            lVar23 = lVar23 + 1;
          } while (lVar23 != 0xf);
          local_b8 = (sqlite3_stmt *)0x0;
          uVar27 = 0;
          iVar8 = fts3SqlStmt(local_138,0x1b,&local_b8,(sqlite3_value **)0x0);
          psVar6 = local_b8;
          uVar28 = 0;
          if (iVar8 == 0) {
            sqlite3_bind_int64(local_b8,1,(long)pFVar30->iPrevLangid);
            sqlite3_bind_int64(psVar6,2,(long)pFVar30->nIndex);
            uVar27 = 0;
LAB_001cf160:
            psVar6 = local_b8;
            iVar8 = sqlite3_step(local_b8);
            if (iVar8 == 100) goto code_r0x001cf179;
            iVar8 = sqlite3_reset(psVar6);
            if (iVar8 == 0) {
              local_110 = pFVar30->pTokenizer->pModule;
              local_a8.apSegment = (Fts3SegReader **)0x0;
              pVVar11 = (Vdbe *)0x0;
              pcVar20 = sqlite3_mprintf("SELECT %s",pFVar30->zReadExprlist);
              if (pcVar20 == (char *)0x0) {
                iVar8 = 7;
                uVar28 = 0;
              }
              else {
                uVar28 = 0;
                iVar8 = sqlite3LockAndPrepare
                                  (pFVar30->db,pcVar20,-1,0x80,(Vdbe *)0x0,
                                   (sqlite3_stmt **)&local_a8,(char **)0x0);
                sqlite3_free(pcVar20);
                pVVar11 = (Vdbe *)local_a8.apSegment;
                if (iVar8 == 0) {
                  iVar8 = sqlite3_step((sqlite3_stmt *)local_a8.apSegment);
                  if (iVar8 == 100) {
                    uVar28 = 0;
                    local_48 = pVVar11;
                    pFVar30 = local_138;
                    local_e0 = uVar27;
                    do {
                      pMVar12 = columnMem((sqlite3_stmt *)pVVar11,0);
                      puVar14 = (u32 *)sqlite3VdbeIntValue(pMVar12);
                      columnMallocFailure((sqlite3_stmt *)pVVar11);
                      iVar31 = langidFromSelect(pFVar30,(sqlite3_stmt *)pVVar11);
                      iVar8 = pFVar30->nColumn;
                      if (0 < iVar8) {
                        local_d0 = CONCAT44(local_d0._4_4_,iVar31);
                        local_40 = ((long)puVar14 * 9 + (long)iVar31) * 0x51;
                        puVar15 = (u32 *)0x0;
                        local_d8 = puVar14;
                        do {
                          puVar14 = (u32 *)((long)puVar15 + 1);
                          if (pFVar30->abNotindexed[(long)puVar15] == '\0') {
                            local_c8 = puVar15;
                            puVar16 = sqlite3_column_text((sqlite3_stmt *)pVVar11,(int)puVar14);
                            local_c0 = puVar14;
                            iVar8 = sqlite3_column_bytes((sqlite3_stmt *)pVVar11,(int)puVar14);
                            local_f8.zTerm = (char *)0x0;
                            iVar8 = sqlite3Fts3OpenTokenizer
                                              (pFVar30->pTokenizer,(int)local_d0,(char *)puVar16,
                                               iVar8,(sqlite3_tokenizer_cursor **)&local_f8);
                            psVar22 = (sqlite3_tokenizer_cursor *)local_f8.zTerm;
                            if (iVar8 == 0) {
                              local_118 = local_118 & 0xffffffff00000000;
                              local_120 = local_120 & 0xffffffff00000000;
                              local_104 = 0;
                              local_124 = 0;
                              iVar8 = (*local_110->xNext)((sqlite3_tokenizer_cursor *)local_f8.zTerm
                                                          ,&local_100,(int *)&local_118,
                                                          (int *)&local_120,&local_104,&local_124);
                              if (iVar8 == 0) {
                                local_b0 = psVar22;
                                local_38 = (local_40 + (long)local_c8) * 9;
                                do {
                                  pcVar20 = local_100;
                                  iVar8 = (int)local_118;
                                  local_130 = (Vdbe *)(long)local_124;
                                  puVar17 = (undefined1 *)((long)&local_130->db + local_38);
                                  if (0 < (long)(int)local_118) {
                                    lVar23 = 0;
                                    do {
                                      puVar17 = (undefined1 *)
                                                ((long)puVar17 * 9 + (long)local_100[lVar23]);
                                      lVar23 = lVar23 + 1;
                                    } while ((int)local_118 != lVar23);
                                  }
                                  uVar28 = uVar28 ^ (ulong)puVar17;
                                  iVar31 = pFVar30->nIndex;
                                  if (1 < (long)iVar31) {
                                    pFVar33 = pFVar30->aIndex;
                                    lVar23 = 1;
                                    do {
                                      pFVar33 = pFVar33 + 1;
                                      if (pFVar33->nPrefix <= iVar8) {
                                        uVar13 = fts3ChecksumEntry(pcVar20,pFVar33->nPrefix,
                                                                   (int)local_d0,(int)lVar23,
                                                                   (i64)local_d8,(int)local_c8,
                                                                   (int)local_130);
                                        uVar28 = uVar28 ^ uVar13;
                                      }
                                      lVar23 = lVar23 + 1;
                                    } while (iVar31 != lVar23);
                                  }
                                  local_118 = local_118 & 0xffffffff00000000;
                                  local_120 = local_120 & 0xffffffff00000000;
                                  local_104 = 0;
                                  local_124 = 0;
                                  iVar8 = (*local_110->xNext)(local_b0,&local_100,(int *)&local_118,
                                                              (int *)&local_120,&local_104,
                                                              &local_124);
                                  psVar22 = local_b0;
                                  uVar27 = local_e0;
                                  pFVar30 = local_138;
                                  pVVar11 = local_48;
                                } while (iVar8 == 0);
                              }
                            }
                            if (psVar22 != (sqlite3_tokenizer_cursor *)0x0) {
                              (*local_110->xClose)(psVar22);
                            }
                            if (iVar8 != 0x65) goto LAB_001cfd75;
                            iVar8 = pFVar30->nColumn;
                            puVar14 = local_c0;
                          }
                          puVar15 = puVar14;
                        } while ((long)puVar15 < (long)iVar8);
                      }
                      iVar31 = sqlite3_step((sqlite3_stmt *)pVVar11);
                      iVar8 = 0;
                    } while (iVar31 == 100);
                  }
                  else {
                    iVar8 = 0;
                  }
                }
              }
LAB_001cfd75:
              sqlite3_finalize((sqlite3_stmt *)pVVar11);
              goto LAB_001cf661;
            }
            goto LAB_001cf65e;
          }
          goto LAB_001cf661;
        }
LAB_001cf3b6:
        iVar31 = 1;
        if (6 < iVar8) {
          lVar23 = 0;
          do {
            if ((ulong)*(byte *)((long)pvVar10 + lVar23) == 0) {
              uVar26 = ""[(byte)"automerge="[lVar23 + 4]];
              uVar25 = '\0';
LAB_001cf407:
              if (uVar25 != uVar26) {
                if (iVar8 < 0xb) goto LAB_001cf675;
                lVar23 = 0;
                goto LAB_001cf4fe;
              }
              break;
            }
            uVar25 = ""[*(byte *)((long)pvVar10 + lVar23)];
            uVar26 = ""[(byte)"automerge="[lVar23 + 4]];
            if (uVar25 != uVar26) goto LAB_001cf407;
            lVar23 = lVar23 + 1;
          } while (lVar23 != 6);
          lVar23 = (long)pvVar10 + 6;
          bVar19 = *(byte *)((long)pvVar10 + 6);
          iVar8 = 0;
          if ('/' < (char)bVar19) {
            iVar8 = 0;
            do {
              iVar31 = 1;
              if ((0x39 < bVar19) || (0xcccccca < iVar8)) goto LAB_001cf675;
              iVar8 = (uint)bVar19 + iVar8 * 10 + -0x30;
              bVar19 = *(byte *)(lVar23 + 1);
              lVar23 = lVar23 + 1;
            } while ('/' < (char)bVar19);
          }
          iVar9 = 8;
          if (bVar19 == 0x2c) {
            bVar19 = *(byte *)(lVar23 + 1);
            iVar31 = 1;
            if ((char)bVar19 < '0') goto LAB_001cf675;
            pbVar29 = (byte *)(lVar23 + 2);
            iVar9 = 0;
            do {
              if ((0x39 < bVar19) || (0xcccccca < iVar9)) goto LAB_001cf675;
              iVar9 = (uint)bVar19 + iVar9 * 10 + -0x30;
              bVar19 = *pbVar29;
              pbVar29 = pbVar29 + 1;
            } while ('/' < (char)bVar19);
          }
          iVar31 = 1;
          if ((bVar19 == 0) && (1 < iVar9)) {
            local_a8.apSegment = (Fts3SegReader **)((ulong)local_a8.apSegment & 0xffffffff00000000);
            if (local_138->bHasStat == '\0') {
              sqlite3Fts3CreateStatTable((int *)&local_a8,local_138);
              pFVar30 = local_138;
              iVar31 = (int)local_a8.apSegment;
              if ((int)local_a8.apSegment == 0) goto LAB_001cf4d8;
            }
            else {
LAB_001cf4d8:
              pFVar30 = local_138;
              iVar31 = sqlite3Fts3Incrmerge(local_138,iVar8,iVar9);
            }
            sqlite3_blob_close(pFVar30->pSegments);
            pFVar30->pSegments = (sqlite3_blob *)0x0;
          }
        }
      }
    }
  }
  goto LAB_001cf675;
code_r0x001cf179:
  iVar8 = 0;
  pMVar12 = columnMem(psVar6,0);
  local_130 = (Vdbe *)sqlite3VdbeIntValue(pMVar12);
  columnMallocFailure(psVar6);
  if (0 < pFVar30->nIndex) {
    iVar31 = 0;
    do {
      local_f8.zTerm = (char *)0x0;
      local_f8.nTerm = 0;
      local_f8.iCol = 0;
      local_f8.flags = 0x13;
      local_f8._20_4_ = 0;
      local_a8.apSegment = (Fts3SegReader **)0x0;
      local_a8.nSegment = 0;
      local_a8.nAdvance = 0;
      local_a8.pFilter = (Fts3SegFilter *)0x0;
      local_a8.aBuffer = (char *)0x0;
      local_a8.nBuffer = 0;
      local_a8.iColFilter = 0;
      local_a8.bRestart = 0;
      local_a8.nCost = 0;
      local_a8.bLookup = 0;
      local_a8._52_4_ = 0;
      local_a8.zTerm = (char *)0x0;
      local_a8.nTerm = 0;
      local_a8._68_4_ = 0;
      local_a8.aDoclist = (char *)0x0;
      local_a8.nDoclist = 0;
      local_a8._84_4_ = 0;
      iVar8 = fts3SegReaderCursor(pFVar30,(int)local_130,iVar31,-2,(char *)0x0,0,0,1,&local_a8);
      if (iVar8 == 0) {
        local_a8.pFilter = &local_f8;
        iVar8 = fts3SegReaderStart(pFVar30,&local_a8,(char *)0x0,0);
        if ((iVar8 != 0) || (iVar8 = sqlite3Fts3SegReaderStep(pFVar30,&local_a8), iVar8 != 100))
        goto LAB_001cf37c;
        uVar28 = 0;
        local_e0 = uVar27;
        do {
          pcVar20 = local_a8.aDoclist;
          iVar8 = local_a8.nDoclist;
          lVar23 = (long)local_a8.nDoclist;
          local_100 = (char *)0x0;
          local_118 = 0;
          iVar9 = sqlite3Fts3GetVarint(local_a8.aDoclist,(sqlite_int64 *)&local_100);
          if (iVar9 < iVar8) {
            pcVar21 = pcVar20 + lVar23;
            pcVar20 = pcVar20 + iVar9;
            lVar23 = 0;
            do {
              local_120 = 0;
              iVar8 = sqlite3Fts3GetVarint(pcVar20,(sqlite_int64 *)&local_120);
              pcVar20 = pcVar20 + iVar8;
              if (pcVar20 < pcVar21) {
                if (local_120 < 2) {
                  local_118 = 0;
                  if (local_120 == 0) {
                    iVar8 = sqlite3Fts3GetVarint(pcVar20,(sqlite_int64 *)&local_120);
                    local_100 = local_100 + local_120;
                  }
                  else {
                    iVar8 = sqlite3Fts3GetVarint(pcVar20,(sqlite_int64 *)&local_118);
                  }
                  pcVar20 = pcVar20 + iVar8;
                  lVar23 = 0;
                }
                else {
                  lVar23 = lVar23 + local_120 + -2;
                  uVar13 = fts3ChecksumEntry(local_a8.zTerm,local_a8.nTerm,(int)local_130,iVar31,
                                             (i64)local_100,(int)local_118,(int)lVar23);
                  uVar28 = uVar28 ^ uVar13;
                }
              }
            } while (pcVar20 < pcVar21);
          }
          pFVar30 = local_138;
          iVar8 = sqlite3Fts3SegReaderStep(local_138,&local_a8);
          uVar27 = local_e0;
        } while (iVar8 == 100);
      }
      else {
LAB_001cf37c:
        uVar28 = 0;
      }
      uVar27 = uVar27 ^ uVar28;
      sqlite3Fts3SegReaderFinish(&local_a8);
      iVar31 = iVar31 + 1;
    } while (iVar31 < pFVar30->nIndex);
  }
  if (iVar8 != 0) goto code_r0x001cf3a4;
  goto LAB_001cf160;
code_r0x001cf3a4:
  sqlite3_reset(local_b8);
LAB_001cf65e:
  uVar28 = 0;
LAB_001cf661:
  iVar31 = 0x10b;
  if (uVar27 == uVar28) {
    iVar31 = iVar8;
  }
  if (iVar8 != 0) {
    iVar31 = iVar8;
  }
  goto LAB_001cf675;
  while( true ) {
    uVar25 = ""[*(byte *)((long)pvVar10 + lVar23)];
    uVar26 = ""[(byte)"automerge="[lVar23]];
    if (uVar25 != uVar26) goto LAB_001cf721;
    lVar23 = lVar23 + 1;
    if (lVar23 == 10) break;
LAB_001cf4fe:
    if ((ulong)*(byte *)((long)pvVar10 + lVar23) == 0) {
      uVar26 = ""[(byte)"automerge="[lVar23]];
      uVar25 = '\0';
LAB_001cf721:
      if (uVar25 != uVar26) goto LAB_001cf675;
      break;
    }
  }
  local_f8.zTerm = (char *)((ulong)local_f8.zTerm & 0xffffffff00000000);
  local_a8.apSegment = (Fts3SegReader **)0x0;
  bVar19 = *(byte *)((long)pvVar10 + 10);
  iVar8 = 0;
  if ('/' < (char)bVar19) {
    pbVar29 = (byte *)((long)pvVar10 + 0xb);
    iVar8 = 0;
    do {
      if ((0x39 < bVar19) || (0xcccccca < iVar8)) break;
      iVar8 = (uint)bVar19 + iVar8 * 10 + -0x30;
      bVar19 = *pbVar29;
      pbVar29 = pbVar29 + 1;
    } while ('/' < (char)bVar19);
  }
  iVar31 = iVar8;
  if (0x10 < iVar8) {
    iVar31 = 8;
  }
  if (iVar8 == 1) {
    iVar31 = 8;
  }
  local_138->nAutoincrmerge = iVar31;
  if (local_138->bHasStat == '\0') {
    sqlite3Fts3CreateStatTable((int *)&local_f8,local_138);
    iVar31 = (int)local_f8.zTerm;
    if ((int)local_f8.zTerm != 0) goto LAB_001cf675;
  }
  iVar31 = fts3SqlStmt(pFVar30,0x17,(sqlite3_stmt **)&local_a8,(sqlite3_value **)0x0);
  ppFVar7 = local_a8.apSegment;
  if (iVar31 == 0) {
    sqlite3_bind_int64((sqlite3_stmt *)local_a8.apSegment,1,2);
    sqlite3_bind_int64((sqlite3_stmt *)ppFVar7,2,(long)pFVar30->nAutoincrmerge);
    sqlite3_step((sqlite3_stmt *)ppFVar7);
    iVar31 = sqlite3_reset((sqlite3_stmt *)ppFVar7);
  }
LAB_001cf675:
  local_13c = iVar31;
  puVar14 = (u32 *)0x0;
  iVar31 = local_13c;
LAB_001cf678:
  local_13c = iVar31;
  sqlite3_free(puVar14);
  pFVar30 = local_138;
  sqlite3_blob_close(local_138->pSegments);
  pFVar30->pSegments = (sqlite3_blob *)0x0;
  return local_13c;
}

Assistant:

static int fts3UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  return sqlite3Fts3UpdateMethod(pVtab, nArg, apVal, pRowid);
}